

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ILBDOperator.cpp
# Opt level: O3

void __thiscall
lts2::LBDOperator::drawBasis
          (LBDOperator *this,vector<cv::Mat,_std::allocator<cv::Mat>_> *basisFunctions,int normalize
          )

{
  _InputArray *p_Var1;
  ulong uVar2;
  long lVar3;
  Mat negPart;
  _InputArray local_e8;
  _InputArray local_d0;
  int local_b4;
  LBDOperator *local_b0;
  _OutputArray local_a8;
  Mat local_90 [96];
  
  local_b4 = normalize;
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::resize
            (basisFunctions,(ulong)*(uint *)&(this->super_LinearOperator).field_0xc);
  cv::Mat::Mat(local_90);
  if (*(int *)&(this->super_LinearOperator).field_0xc != 0) {
    lVar3 = 0;
    uVar2 = 0;
    local_b0 = this;
    do {
      fillBasisFunctionForIndex(local_b0,(Mat *)(*(long *)basisFunctions + lVar3),(int)uVar2);
      if (local_b4 < 1) {
        if (local_b4 != 0) goto LAB_00104b47;
      }
      else {
        local_e8.obj = (void *)(*(long *)basisFunctions + lVar3);
        local_e8.sz.width = 0;
        local_e8.sz.height = 0;
        local_e8.flags = 0x1010000;
        local_d0.sz.width = 0;
        local_d0.sz.height = 0;
        local_d0.flags = 0x2010000;
        local_d0.obj = local_90;
        cv::threshold(&local_e8,(_OutputArray *)&local_d0,-1.1754943508222875e-38,-1.0,1);
        local_e8.obj = (void *)(*(long *)basisFunctions + lVar3);
        local_e8.sz.width = 0;
        local_e8.sz.height = 0;
        local_e8.flags = 0x1010000;
        local_d0.sz.width = 0;
        local_d0.sz.height = 0;
        local_d0.flags = 0x2010000;
        local_d0.obj = local_e8.obj;
        cv::threshold(&local_e8,(_OutputArray *)&local_d0,1.1754943508222875e-38,1.0,0);
        local_e8.obj = (void *)(*(long *)basisFunctions + lVar3);
        local_e8.sz.width = 0;
        local_e8.sz.height = 0;
        local_e8.flags = 0x1010000;
        local_d0.sz.width = 0;
        local_d0.sz.height = 0;
        local_d0.flags = 0x1010000;
        local_d0.obj = local_90;
        local_a8.super__InputArray.sz.width = 0;
        local_a8.super__InputArray.sz.height = 0;
        local_a8.super__InputArray.flags = -0x3dff0000;
        local_a8.super__InputArray.obj = local_e8.obj;
        p_Var1 = (_InputArray *)cv::noArray();
        cv::add(&local_e8,&local_d0,&local_a8,p_Var1,-1);
LAB_00104b47:
        local_e8.obj = (void *)(*(long *)basisFunctions + lVar3);
        local_e8.sz.width = 0;
        local_e8.sz.height = 0;
        local_e8.flags = 0x1010000;
        local_d0.sz.width = 0;
        local_d0.sz.height = 0;
        local_d0.flags = 0x3010000;
        local_d0.obj = local_e8.obj;
        p_Var1 = (_InputArray *)cv::noArray();
        cv::normalize(&local_e8,(_InputOutputArray *)&local_d0,0.0,1.0,0x20,-1,p_Var1);
      }
      uVar2 = uVar2 + 1;
      lVar3 = lVar3 + 0x60;
    } while (uVar2 < *(uint *)&(local_b0->super_LinearOperator).field_0xc);
  }
  cv::Mat::~Mat(local_90);
  return;
}

Assistant:

void lts2::LBDOperator::drawBasis(std::vector<cv::Mat> &basisFunctions, int normalize) const
{
  basisFunctions.resize(_pairsInUse);
  cv::Mat negPart;

  for (int i = 0; i < _pairsInUse; ++i)
  {
    this->fillBasisFunctionForIndex(basisFunctions[i], i);

    if (normalize > 0) {
      cv::threshold(basisFunctions[i], negPart, -FLT_MIN, -1.0, cv::THRESH_BINARY_INV);
      cv::threshold(basisFunctions[i], basisFunctions[i], FLT_MIN, 1.0, cv::THRESH_BINARY);
      basisFunctions[i] += negPart;
    }
    if (normalize != 0) cv::normalize(basisFunctions[i], basisFunctions[i], 0.0, 1.0, cv::NORM_MINMAX);
  }
}